

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O2

void monster_groups_verify(chunk_conflict *c)

{
  wchar_t wVar1;
  monster *pmVar2;
  ulong uVar3;
  monster_group *pmVar4;
  char *fmt;
  ulong uVar5;
  
  uVar5 = 0;
  while( true ) {
    if (z_info->level_monster_max <= uVar5) {
      return;
    }
    pmVar4 = c->monster_groups[uVar5];
    if (pmVar4 != (monster_group *)0x0) break;
LAB_00160e4f:
    uVar5 = uVar5 + 1;
  }
LAB_00160e46:
  do {
    pmVar4 = (monster_group *)pmVar4->member_list;
    if (pmVar4 == (monster_group *)0x0) goto LAB_00160e4f;
    pmVar2 = cave_monster(c,pmVar4->index);
    uVar3 = (ulong)(uint)pmVar2->group_info[0].index;
    if (uVar5 != uVar3) {
      wVar1 = pmVar2->group_info[1].index;
      if ((ulong)(uint)wVar1 == 0) {
        fmt = "Bad group index: group: %d, monster: %d";
      }
      else {
        if (uVar5 != (uint)wVar1) {
          quit_fmt("Bad group index: group: %d, monster: %d",uVar5 & 0xffffffff,(ulong)(uint)wVar1);
        }
        if (pmVar2->group_info[1].role == MON_GROUP_LEADER) goto LAB_00160e46;
        uVar3 = (ulong)(uint)pmVar2->group_info[1].index;
        fmt = "Bad monster role: group: %d, monster: %d";
      }
      quit_fmt(fmt,uVar5 & 0xffffffff,uVar3);
    }
  } while( true );
}

Assistant:

void monster_groups_verify(struct chunk *c)
{
	int i;

	for (i = 0; i < z_info->level_monster_max; i++) {
		if (c->monster_groups[i]) {
			struct monster_group *group = c->monster_groups[i];
			struct mon_group_list_entry *entry = group->member_list;
			while (entry) {
				struct monster *mon = cave_monster(c, entry->midx);
				struct monster_group_info *info = mon->group_info;
				if (info[PRIMARY_GROUP].index != i) {
					if (info[SUMMON_GROUP].index) {
						if (info[SUMMON_GROUP].index != i) {
							quit_fmt("Bad group index: group: %d, monster: %d",
									 i, info[SUMMON_GROUP].index);
						}
						if (info[SUMMON_GROUP].role != MON_GROUP_LEADER) {
							quit_fmt("Bad monster role: group: %d, monster: %d",
									 i, info[SUMMON_GROUP].index);
						}
					} else {
						quit_fmt("Bad group index: group: %d, monster: %d",
								 i, info[PRIMARY_GROUP].index);
					}
				}
				entry = entry->next;
			}
		}
	}
}